

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::(anonymous_namespace)::
     partition3<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,xpath_node pivot,document_order_comparator *pred,
               xpath_node **out_eqbeg,xpath_node **out_eqend)

{
  bool bVar1;
  xml_node_struct *in_RSI;
  xml_node_struct *in_RDI;
  undefined8 *in_R9;
  xpath_node *it;
  xpath_node *eqbeg;
  xpath_node *gt;
  xpath_node *lt;
  xpath_node *eq;
  xpath_node *in_stack_00000058;
  document_order_comparator *in_stack_00000068;
  xml_node_struct *local_58;
  xml_node_struct *local_50;
  xml_node_struct *pxVar2;
  xml_node_struct *this;
  xml_node_struct *local_38;
  
  local_50 = in_RSI;
  this = in_RDI;
  local_38 = in_RDI;
  while (local_58 = in_RDI, pxVar2 = local_50, this < local_50) {
    bVar1 = anon_unknown_0::document_order_comparator::operator()
                      (in_stack_00000068,(xpath_node *)out_eqend,in_stack_00000058);
    if (bVar1) {
      this = (xml_node_struct *)&this->value;
    }
    else {
      bVar1 = xpath_node::operator==((xpath_node *)this,(xpath_node *)local_50);
      if (bVar1) {
        pxVar2 = (xml_node_struct *)&this->value;
        anon_unknown_0::swap<pugi::xpath_node>((xpath_node *)local_38,(xpath_node *)this);
        this = pxVar2;
        local_38 = (xml_node_struct *)&local_38->value;
      }
      else {
        local_50 = (xml_node_struct *)&local_50[-1].next_sibling;
        anon_unknown_0::swap<pugi::xpath_node>((xpath_node *)this,(xpath_node *)local_50);
      }
    }
  }
  for (; local_58 != local_38; local_58 = (xml_node_struct *)&local_58->value) {
    local_50 = (xml_node_struct *)&local_50[-1].next_sibling;
    anon_unknown_0::swap<pugi::xpath_node>((xpath_node *)local_58,(xpath_node *)local_50);
  }
  *in_R9 = local_50;
  (eqbeg->_node)._root = pxVar2;
  return;
}

Assistant:

PUGI__FN void partition3(T* begin, T* end, T pivot, const Pred& pred, T** out_eqbeg, T** out_eqend)
	{
		// invariant: array is split into 4 groups: = < ? > (each variable denotes the boundary between the groups)
		T* eq = begin;
		T* lt = begin;
		T* gt = end;

		while (lt < gt)
		{
			if (pred(*lt, pivot))
				lt++;
			else if (*lt == pivot)
				swap(*eq++, *lt++);
			else
				swap(*lt, *--gt);
		}

		// we now have just 4 groups: = < >; move equal elements to the middle
		T* eqbeg = gt;

		for (T* it = begin; it != eq; ++it)
			swap(*it, *--eqbeg);

		*out_eqbeg = eqbeg;
		*out_eqend = gt;
	}